

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ManCheckTopoOrder_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool local_49;
  Gia_Obj_t *local_40;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if (pObj->Value == 0) {
    p_local._4_4_ = 1;
  }
  else {
    pObj->Value = 0;
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                    ,0xd7,"int Gia_ManCheckTopoOrder_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar2 = Gia_ObjFanin0(pObj);
    iVar1 = Gia_ManCheckTopoOrder_rec(p,pGVar2);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      pGVar2 = Gia_ObjFanin1(pObj);
      iVar1 = Gia_ManCheckTopoOrder_rec(p,pGVar2);
      if (iVar1 == 0) {
        p_local._4_4_ = 0;
      }
      else {
        if (p->pReprs == (Gia_Rpr_t *)0x0) {
          local_40 = (Gia_Obj_t *)0x0;
        }
        else {
          iVar1 = Gia_ObjId(p,pObj);
          local_40 = Gia_ObjReprObj(p,iVar1);
        }
        local_49 = true;
        if (local_40 != (Gia_Obj_t *)0x0) {
          local_49 = local_40->Value == 0;
        }
        p_local._4_4_ = (uint)local_49;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManCheckTopoOrder_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr;
    if ( pObj->Value == 0 )
        return 1;
    pObj->Value = 0;
    assert( Gia_ObjIsAnd(pObj) );
    if ( !Gia_ManCheckTopoOrder_rec( p, Gia_ObjFanin0(pObj) ) )
        return 0;
    if ( !Gia_ManCheckTopoOrder_rec( p, Gia_ObjFanin1(pObj) ) )
        return 0;
    pRepr = p->pReprs ? Gia_ObjReprObj( p, Gia_ObjId(p,pObj) ) : NULL;
    return pRepr == NULL || pRepr->Value == 0;
}